

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseInstr(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var5;
  ExprList *pEVar6;
  _Head_base<0UL,_wabt::Expr_*,_false> local_18;
  
  TVar3 = Peek(this,0);
  if ((TVar3 - AtomicLoad < 0x3e) &&
     ((0x37ff7effbd9fbf7fU >> ((ulong)(TVar3 - AtomicLoad) & 0x3f) & 1) != 0)) {
    local_18._M_head_impl = (Expr *)0x0;
    RVar4 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_18);
    _Var5._M_head_impl = local_18._M_head_impl;
    if (RVar4.enum_ != Error) {
      local_18._M_head_impl = (Expr *)0x0;
LAB_00184814:
      if ((((_Var5._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
         (((_Var5._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
        pEVar1 = exprs->last_;
        pEVar6 = exprs;
        if (pEVar1 != (Expr *)0x0) {
          ((_Var5._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
          pEVar6 = (ExprList *)&pEVar1->super_intrusive_list_base<wabt::Expr>;
        }
        pEVar6->first_ = _Var5._M_head_impl;
        exprs->last_ = _Var5._M_head_impl;
        exprs->size_ = exprs->size_ + 1;
        return (Result)Ok;
      }
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                    ,0x1bf,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
  }
  else {
    TVar3 = Peek(this,0);
    if ((0x34 < TVar3 - Block) || ((0x10000000840001U >> ((ulong)(TVar3 - Block) & 0x3f) & 1) == 0))
    {
      bVar2 = PeekMatchExpr(this);
      if (bVar2) {
        RVar4 = ParseExpr(this,exprs);
        return (Result)RVar4.enum_;
      }
      __assert_fail("!\"ParseInstr should only be called when IsInstr() is true\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                    ,0x67a,"Result wabt::WastParser::ParseInstr(ExprList *)");
    }
    local_18._M_head_impl = (Expr *)0x0;
    RVar4 = ParseBlockInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_18);
    _Var5._M_head_impl = local_18._M_head_impl;
    if (RVar4.enum_ != Error) goto LAB_00184814;
  }
  if (local_18._M_head_impl != (Expr *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Expr[1])();
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseInstr(ExprList* exprs) {
  WABT_TRACE(ParseInstr);
  if (IsPlainInstr(Peek())) {
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    exprs->push_back(std::move(expr));
    return Result::Ok;
  } else if (IsBlockInstr(Peek())) {
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParseBlockInstr(&expr));
    exprs->push_back(std::move(expr));
    return Result::Ok;
  } else if (PeekMatchExpr()) {
    return ParseExpr(exprs);
  } else {
    assert(!"ParseInstr should only be called when IsInstr() is true");
    return Result::Error;
  }
}